

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

ChildrenAnswers * __thiscall
IRT::PrintVisitor::VisitChildren
          (ChildrenAnswers *__return_storage_ptr__,PrintVisitor *this,
          vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *children)

{
  pointer ppIVar1;
  INode *pIVar2;
  ulong uVar3;
  string local_50;
  
  (__return_storage_ptr__->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    ppIVar1 = (children->super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(children->
                      super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1 >> 3) <= uVar3)
    break;
    pIVar2 = ppIVar1[uVar3];
    if (pIVar2 != (INode *)0x0) {
      (**pIVar2->_vptr_INode)(pIVar2,this);
      std::__cxx11::string::string((string *)&local_50,(string *)&this->description);
      ChildrenAnswers::PushBack(__return_storage_ptr__,&local_50,this->lastVisited);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::assign((char *)&this->description);
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

IRT::ChildrenAnswers IRT::PrintVisitor::VisitChildren( std::vector<const INode *> children ) {
    ChildrenAnswers answers = ChildrenAnswers( );
    for ( int i = 0; i < children.size( ); i++ ) {
        if ( children[ i ] ) {
            children[ i ]->Accept( *this );
            answers.PushBack( this->description, lastVisited );
            this->description = "";
        }
    }
    return answers;
}